

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

void __thiscall randomx::Instruction::h_IXOR_R(Instruction *this,ostream *os)

{
  ostream *this_00;
  long *plVar1;
  uint uVar2;
  uint32_t uVar3;
  
  uVar2 = this->dst & 7;
  uVar3 = this->src & 7;
  if ((char)uVar2 == (char)uVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"r",1);
    this_00 = (ostream *)std::ostream::operator<<(os,uVar2);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
    uVar3 = this->imm32;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"r",1);
    this_00 = (ostream *)std::ostream::operator<<(os,uVar2);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", r",3);
  }
  plVar1 = (long *)std::ostream::operator<<(this_00,uVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Instruction::h_IXOR_R(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		if (dstIndex != srcIndex) {
			os << "r" << dstIndex << ", r" << srcIndex << std::endl;
		}
		else {
			os << "r" << dstIndex << ", " << (int32_t)getImm32() << std::endl;
		}
	}